

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::getShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,XFBTooSmallStrideTest *this,GLuint test_case_index,
          STAGES stage)

{
  STAGES SVar1;
  int iVar2;
  pointer ptVar3;
  ulong uVar4;
  TestError *pTVar5;
  char *pcVar6;
  bool *text;
  bool *text_00;
  size_t position;
  size_t local_40;
  long local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ptVar3 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  SVar1 = ptVar3[test_case_index].m_stage;
  if (SVar1 != stage) {
    switch(SVar1) {
    case VERTEX:
      pcVar6 = "";
      if (stage == FRAGMENT) {
        pcVar6 = 
        "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 gs_fs;\nout vec4 fs_out;\n\nvoid main()\n{\n    fs_out = gs_fs;\n}\n\n"
        ;
      }
      goto LAB_008a843d;
    case TESS_CTRL:
      if (stage == FRAGMENT) {
LAB_008a8436:
        pcVar6 = 
        "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 gs_fs;\nout vec4 fs_out;\n\nvoid main()\n{\n    fs_out = gs_fs;\n}\n\n"
        ;
        goto LAB_008a843d;
      }
      if (stage == VERTEX) goto LAB_008a835b;
      break;
    case TESS_EVAL:
      if (stage - VERTEX < 5) {
        pcVar6 = (&PTR_anon_var_dwarf_163ab2_0210d0b8)[stage - VERTEX];
        goto LAB_008a843d;
      }
      break;
    case GEOMETRY:
      if (stage == VERTEX) {
LAB_008a835b:
        pcVar6 = 
        "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nin  vec4 in_vs;\nout vec4 vs_tcs;\n\nvoid main()\n{\n    vs_tcs = in_vs;\n}\n\n"
        ;
        goto LAB_008a843d;
      }
      if (stage == FRAGMENT) goto LAB_008a8436;
      break;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x5133);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pcVar6 = "";
LAB_008a843d:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
    return __return_storage_ptr__;
  }
  local_40 = 0;
  uVar4 = (ulong)ptVar3[test_case_index].m_case;
  if (3 < uVar4) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x50d7);
LAB_008a8486:
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (3 < stage - VERTEX) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x50ef);
    goto LAB_008a8486;
  }
  iVar2 = *(int *)(&DAT_01a43668 + uVar4 * 4);
  local_38 = (long)*(int *)(&DAT_01a43678 + uVar4 * 4);
  switch(stage) {
  case VERTEX:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1a4ecac);
    text_00 = glcts::fixed_sample_locations_values + 1;
    text = glcts::fixed_sample_locations_values + 1;
    goto LAB_008a83ce;
  case TESS_CTRL:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1a4e9fc);
    text = (bool *)0x1abd6cc;
    goto LAB_008a83c7;
  case TESS_EVAL:
    pcVar6 = 
    "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nlayout(isolines, point_mode) in;\n\nVAR_DEFINITION\nin  vec4 tcs_tes[];\nout vec4 tes_gs;\n\nvoid main()\n{\n    vec4 result = tcs_tes[0];\n\nVARIABLE_USE\n    tes_gs += result;\n}\n\n"
    ;
    break;
  case GEOMETRY:
    pcVar6 = 
    "#version 430 core\n#extension GL_ARB_enhanced_layouts : require\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nVAR_DEFINITION\nin  vec4 tes_gs[];\nout vec4 gs_fs;\n\nvoid main()\n{\n    vec4 result = tes_gs[0];\n\nVARIABLE_USE\n    gs_fs = result;\n    gl_Position  = vec4(-1, -1, 0, 1);\n    EmitVertex();\n    gs_fs = result;\n    gl_Position  = vec4(-1, 1, 0, 1);\n    EmitVertex();\n    gs_fs = result;\n    gl_Position  = vec4(1, -1, 0, 1);\n    EmitVertex();\n    gs_fs = result;\n    gl_Position  = vec4(1, 1, 0, 1);\n    EmitVertex();\n}\n\n"
    ;
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
  text = (bool *)0x1a5bfbc;
LAB_008a83c7:
  text_00 = (bool *)0x1abd67c;
LAB_008a83ce:
  Utils::replaceToken("VAR_DEFINITION",&local_40,&DAT_01a43668 + iVar2,__return_storage_ptr__);
  local_40 = 0;
  Utils::replaceToken("ARRAY",&local_40,text_00,__return_storage_ptr__);
  Utils::replaceToken("VARIABLE_USE",&local_40,&DAT_01a43678 + local_38,__return_storage_ptr__);
  Utils::replaceAllTokens("INDEX",text,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBTooSmallStrideTest::getShaderSource(GLuint test_case_index, Utils::Shader::STAGES stage)
{
	static const GLchar* array_var_definition = "layout (xfb_buffer = 0, xfb_stride = 32) out;\n"
												"\n"
												"layout (xfb_offset = 16) out vec4 gohanARRAY[4];\n";
	static const GLchar* block_var_definition = "layout (xfb_buffer = 0, xfb_stride = 32) out;\n"
												"\n"
												"layout (xfb_offset = 0) out Goku {\n"
												"    vec4 gohan;\n"
												"    vec4 goten;\n"
												"    vec4 chichi;\n"
												"} gokuARRAY;\n";
	static const GLchar* offset_var_definition = "layout (xfb_buffer = 0, xfb_stride = 40) out;\n"
												 "\n"
												 "layout (xfb_offset = 32) out vec4 gohanARRAY;\n";
	// The test considers gohan overflows the buffer 0, but according to spec, it is valid to declare the variable with qualifier "layout (xfb_offset = 16, xfb_stride = 32) out vec4 gohan;"
	// To make the shader failed to compile, change xfb_stride to a value that is smaller than 32
	static const GLchar* stride_var_definition = "layout (xfb_buffer = 0, xfb_stride = 28) out;\n"
												 "\n"
												 "layout (xfb_offset = 16, xfb_stride = 28) out vec4 gohanARRAY;\n";
	static const GLchar* array_use = "    gohanINDEX[0] = result / 2;\n"
									 "    gohanINDEX[1] = result / 4;\n"
									 "    gohanINDEX[2] = result / 6;\n"
									 "    gohanINDEX[3] = result / 8;\n";
	static const GLchar* block_use = "    gokuINDEX.gohan  = result / 2;\n"
									 "    gokuINDEX.goten  = result / 4;\n"
									 "    gokuINDEX.chichi = result / 6;\n";
	static const GLchar* output_use = "gohanINDEX = result / 4;\n";
	static const GLchar* fs			= "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 gs_fs;\n"
							  "out vec4 fs_out;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    fs_out = gs_fs;\n"
							  "}\n"
							  "\n";
	static const GLchar* gs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "layout(points)                           in;\n"
									 "layout(triangle_strip, max_vertices = 4) out;\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 tes_gs[];\n"
									 "out vec4 gs_fs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = tes_gs[0];\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, -1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "    gs_fs = result;\n"
									 "    gl_Position  = vec4(1, 1, 0, 1);\n"
									 "    EmitVertex();\n"
									 "}\n"
									 "\n";
	static const GLchar* tcs = "#version 430 core\n"
							   "#extension GL_ARB_enhanced_layouts : require\n"
							   "\n"
							   "layout(vertices = 1) out;\n"
							   "\n"
							   "in  vec4 vs_tcs[];\n"
							   "out vec4 tcs_tes[];\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "\n"
							   "    tcs_tes[gl_InvocationID] = vs_tcs[gl_InvocationID];\n"
							   "\n"
							   "    gl_TessLevelOuter[0] = 1.0;\n"
							   "    gl_TessLevelOuter[1] = 1.0;\n"
							   "    gl_TessLevelOuter[2] = 1.0;\n"
							   "    gl_TessLevelOuter[3] = 1.0;\n"
							   "    gl_TessLevelInner[0] = 1.0;\n"
							   "    gl_TessLevelInner[1] = 1.0;\n"
							   "}\n"
							   "\n";
	static const GLchar* tcs_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(vertices = 1) out;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 vs_tcs[];\n"
									  "out vec4 tcs_tes[];\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = vs_tcs[gl_InvocationID];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tcs_tes[gl_InvocationID] = result;\n"
									  "\n"
									  "    gl_TessLevelOuter[0] = 1.0;\n"
									  "    gl_TessLevelOuter[1] = 1.0;\n"
									  "    gl_TessLevelOuter[2] = 1.0;\n"
									  "    gl_TessLevelOuter[3] = 1.0;\n"
									  "    gl_TessLevelInner[0] = 1.0;\n"
									  "    gl_TessLevelInner[1] = 1.0;\n"
									  "}\n"
									  "\n";
	static const GLchar* tes_tested = "#version 430 core\n"
									  "#extension GL_ARB_enhanced_layouts : require\n"
									  "\n"
									  "layout(isolines, point_mode) in;\n"
									  "\n"
									  "VAR_DEFINITION"
									  "\n"
									  "in  vec4 tcs_tes[];\n"
									  "out vec4 tes_gs;\n"
									  "\n"
									  "void main()\n"
									  "{\n"
									  "    vec4 result = tcs_tes[0];\n"
									  "\n"
									  "VARIABLE_USE"
									  "\n"
									  "    tes_gs += result;\n"
									  "}\n"
									  "\n";
	static const GLchar* vs = "#version 430 core\n"
							  "#extension GL_ARB_enhanced_layouts : require\n"
							  "\n"
							  "in  vec4 in_vs;\n"
							  "out vec4 vs_tcs;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    vs_tcs = in_vs;\n"
							  "}\n"
							  "\n";
	static const GLchar* vs_tested = "#version 430 core\n"
									 "#extension GL_ARB_enhanced_layouts : require\n"
									 "\n"
									 "VAR_DEFINITION"
									 "\n"
									 "in  vec4 in_vs;\n"
									 "out vec4 vs_tcs;\n"
									 "\n"
									 "void main()\n"
									 "{\n"
									 "    vec4 result = in_vs;\n"
									 "\n"
									 "VARIABLE_USE"
									 "\n"
									 "    vs_tcs += result;\n"
									 "}\n"
									 "\n";

	std::string source;
	testCase&   test_case = m_test_cases[test_case_index];

	if (test_case.m_stage == stage)
	{
		const GLchar* array	= "";
		const GLchar* index	= "";
		size_t		  position = 0;
		size_t		  temp;
		const GLchar* var_definition = 0;
		const GLchar* var_use		 = 0;

		switch (test_case.m_case)
		{
		case OFFSET:
			var_definition = offset_var_definition;
			var_use		   = output_use;
			break;
		case STRIDE:
			var_definition = stride_var_definition;
			var_use		   = output_use;
			break;
		case BLOCK:
			var_definition = block_var_definition;
			var_use		   = block_use;
			break;
		case ARRAY:
			var_definition = array_var_definition;
			var_use		   = array_use;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		switch (stage)
		{
		case Utils::Shader::GEOMETRY:
			source = gs_tested;
			array  = "[]";
			index  = "[0]";
			break;
		case Utils::Shader::TESS_CTRL:
			source = tcs_tested;
			array  = "[]";
			index  = "[gl_InvocationID]";
			break;
		case Utils::Shader::TESS_EVAL:
			source = tes_tested;
			array  = "[]";
			index  = "[0]";
			break;
		case Utils::Shader::VERTEX:
			source = vs_tested;
			break;
		default:
			TCU_FAIL("Invalid enum");
		}

		temp = position;
		Utils::replaceToken("VAR_DEFINITION", position, var_definition, source);
		position = temp;
		Utils::replaceToken("ARRAY", position, array, source);
		Utils::replaceToken("VARIABLE_USE", position, var_use, source);

		Utils::replaceAllTokens("INDEX", index, source);
	}
	else
	{
		switch (test_case.m_stage)
		{
		case Utils::Shader::GEOMETRY:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_CTRL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::TESS_EVAL:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			case Utils::Shader::TESS_CTRL:
				source = tcs;
				break;
			case Utils::Shader::VERTEX:
				source = vs;
				break;
			default:
				source = "";
			}
			break;
		case Utils::Shader::VERTEX:
			switch (stage)
			{
			case Utils::Shader::FRAGMENT:
				source = fs;
				break;
			default:
				source = "";
			}
			break;
		default:
			TCU_FAIL("Invalid enum");
			break;
		}
	}

	return source;
}